

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corruption_test.cc
# Opt level: O2

void __thiscall leveldb::_Test_CorruptedDescriptor::_Run(_Test_CorruptedDescriptor *this)

{
  DBImpl *this_00;
  Status s;
  Status local_210;
  Status local_208;
  Comparator *local_200;
  string v;
  undefined1 local_1d8 [440];
  
  test::Tester::Tester
            ((Tester *)(local_1d8 + 0x18),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/corruption_test.cc"
             ,0x124);
  s.state_._0_1_ = 0;
  v._M_dataplus._M_p = "foo";
  v._M_string_length = 3;
  local_1d8._8_8_ = "hello";
  local_1d8._16_8_ = (_func_int **)0x5;
  (*((this->super_CorruptionTest).db_)->_vptr_DB[2])(&local_208);
  test::Tester::IsOk((Tester *)(local_1d8 + 0x18),&local_208);
  Status::~Status(&local_208);
  test::Tester::~Tester((Tester *)(local_1d8 + 0x18));
  this_00 = (DBImpl *)(this->super_CorruptionTest).db_;
  DBImpl::TEST_CompactMemTable((DBImpl *)local_1d8);
  Status::~Status((Status *)local_1d8);
  DBImpl::TEST_CompactRange(this_00,0,(Slice *)0x0,(Slice *)0x0);
  CorruptionTest::Corrupt(&this->super_CorruptionTest,kDescriptorFile,0,1000);
  CorruptionTest::TryReopen((CorruptionTest *)&s);
  test::Tester::Tester
            ((Tester *)(local_1d8 + 0x18),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/corruption_test.cc"
             ,299);
  test::Tester::Is((Tester *)(local_1d8 + 0x18),CONCAT71(s.state_._1_7_,s.state_._0_1_) != 0,
                   "!s.ok()");
  test::Tester::~Tester((Tester *)(local_1d8 + 0x18));
  CorruptionTest::RepairDB(&this->super_CorruptionTest);
  CorruptionTest::Reopen(&this->super_CorruptionTest);
  v._M_dataplus._M_p = (pointer)&v.field_2;
  v._M_string_length = 0;
  v.field_2._M_local_buf[0] = '\0';
  test::Tester::Tester
            ((Tester *)(local_1d8 + 0x18),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/corruption_test.cc"
             ,0x130);
  local_1d8._16_8_ = (_func_int **)0x0;
  local_1d8._8_8_ = (Cache *)0x100;
  local_208.state_ = "foo";
  local_200 = (Comparator *)0x3;
  (*((this->super_CorruptionTest).db_)->_vptr_DB[5])(&local_210);
  test::Tester::IsOk((Tester *)(local_1d8 + 0x18),&local_210);
  Status::~Status(&local_210);
  test::Tester::~Tester((Tester *)(local_1d8 + 0x18));
  test::Tester::Tester
            ((Tester *)(local_1d8 + 0x18),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/corruption_test.cc"
             ,0x131);
  test::Tester::IsEq<char[6],std::__cxx11::string>
            ((Tester *)(local_1d8 + 0x18),(char (*) [6])"hello",&v);
  test::Tester::~Tester((Tester *)(local_1d8 + 0x18));
  std::__cxx11::string::~string((string *)&v);
  Status::~Status(&s);
  return;
}

Assistant:

TEST(CorruptionTest, CorruptedDescriptor) {
  ASSERT_OK(db_->Put(WriteOptions(), "foo", "hello"));
  DBImpl* dbi = reinterpret_cast<DBImpl*>(db_);
  dbi->TEST_CompactMemTable();
  dbi->TEST_CompactRange(0, nullptr, nullptr);

  Corrupt(kDescriptorFile, 0, 1000);
  Status s = TryReopen();
  ASSERT_TRUE(!s.ok());

  RepairDB();
  Reopen();
  std::string v;
  ASSERT_OK(db_->Get(ReadOptions(), "foo", &v));
  ASSERT_EQ("hello", v);
}